

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O2

void __thiscall
QDirIteratorPrivate::QDirIteratorPrivate
          (QDirIteratorPrivate *this,QString *path,QStringList *nameFilters,Filters filters,
          IteratorFlags flags)

{
  QDirListing::QDirListing
            (&this->lister,path,nameFilters,
             (uint)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                   super_QFlagsStorage<QDir::Filter>.i,
             (uint)flags.super_QFlagsStorageHelper<QDirIterator::IteratorFlag,_4>.
                   super_QFlagsStorage<QDirIterator::IteratorFlag>.i);
  (this->it).dirEntry.dirListPtr = (QDirListingPrivate *)0x0;
  QFileInfo::QFileInfo(&this->currentFileInfo);
  QFileInfo::QFileInfo(&this->nextFileInfo);
  init(this,(EVP_PKEY_CTX *)path);
  return;
}

Assistant:

QDirIteratorPrivate(const QString &path, const QStringList &nameFilters = {},
                        QDir::Filters filters = QDir::NoFilter,
                        QDirIterator::IteratorFlags flags = QDirIterator::NoIteratorFlags)
        : lister(path, nameFilters, filters.toInt(), flags.toInt())
    { init(); }